

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O2

void __thiscall
pica::Grid<(pica::Dimension)3,_double>::Grid
          (Grid<(pica::Dimension)3,_double> *this,PositionType *origin,PositionType *step,
          IndexType *size)

{
  IndexType_conflict size_00;
  IndexType_conflict size_01;
  IndexType_conflict size_02;
  IndexType_conflict size_03;
  IndexType_conflict size_04;
  IndexType_conflict size_05;
  IndexType_conflict size_06;
  IndexType_conflict size_07;
  IndexType_conflict size_08;
  double dVar1;
  
  size_00.x = size->x;
  size_00.y = size->y;
  size_00.z = size->z;
  Array3d<double>::Array3d(&this->exData,size_00,0.0);
  size_01.x = size->x;
  size_01.y = size->y;
  size_01.z = size->z;
  Array3d<double>::Array3d(&this->eyData,size_01,0.0);
  size_02.x = size->x;
  size_02.y = size->y;
  size_02.z = size->z;
  Array3d<double>::Array3d(&this->ezData,size_02,0.0);
  size_03.x = size->x;
  size_03.y = size->y;
  size_03.z = size->z;
  Array3d<double>::Array3d(&this->bxData,size_03,0.0);
  size_04.x = size->x;
  size_04.y = size->y;
  size_04.z = size->z;
  Array3d<double>::Array3d(&this->byData,size_04,0.0);
  size_05.x = size->x;
  size_05.y = size->y;
  size_05.z = size->z;
  Array3d<double>::Array3d(&this->bzData,size_05,0.0);
  size_06.x = size->x;
  size_06.y = size->y;
  size_06.z = size->z;
  Array3d<double>::Array3d(&this->jxData,size_06,0.0);
  size_07.x = size->x;
  size_07.y = size->y;
  size_07.z = size->z;
  Array3d<double>::Array3d(&this->jyData,size_07,0.0);
  size_08.x = size->x;
  size_08.y = size->y;
  size_08.z = size->z;
  Array3d<double>::Array3d(&this->jzData,size_08,0.0);
  (this->origin).z = origin->z;
  dVar1 = origin->y;
  (this->origin).x = origin->x;
  (this->origin).y = dVar1;
  dVar1 = step->y;
  (this->step).x = step->x;
  (this->step).y = dVar1;
  (this->step).z = step->z;
  return;
}

Assistant:

Grid(const PositionType& origin, const PositionType& step, const IndexType& size) :
        exData(size),
        eyData(size),
        ezData(size),
        bxData(size),
        byData(size),
        bzData(size),
        jxData(size),
        jyData(size),
        jzData(size),
        origin(origin),
        step(step) {}